

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  SequenceNumber SVar12;
  Iterator *scratch;
  undefined4 extraout_var;
  Comparator *pCVar13;
  uint64_t uVar14;
  undefined4 extraout_var_00;
  uint64_t uVar15;
  size_type sVar16;
  char *pcVar17;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  size_t i_1;
  int i;
  int which;
  bool drop;
  uint64_t imm_start;
  SequenceNumber last_sequence_for_key;
  bool has_current_user_key;
  Iterator *input;
  int64_t imm_micros;
  uint64_t start_micros;
  Status *status;
  CompactionStats stats;
  Slice key;
  ParsedInternalKey ikey;
  LevelSummaryStorage tmp;
  string current_user_key;
  DBImpl *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  DBImpl *in_stack_fffffffffffffce8;
  Logger *pLVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfe;
  undefined1 in_stack_fffffffffffffcff;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  Slice *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  DBImpl *in_stack_fffffffffffffd28;
  Compaction *in_stack_fffffffffffffd30;
  undefined5 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3d;
  undefined1 in_stack_fffffffffffffd3e;
  undefined1 in_stack_fffffffffffffd3f;
  DBImpl *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  Compaction *in_stack_fffffffffffffd60;
  VersionSet *in_stack_fffffffffffffd68;
  Iterator *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  DBImpl *in_stack_fffffffffffffdb8;
  byte local_1fa;
  ulong local_1c0;
  int local_1b4;
  int local_1b0;
  ulong local_1a0;
  undefined1 local_130 [56];
  undefined1 local_f8 [88];
  ulong local_a0;
  int local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(**(long **)(in_RSI + 8) + 0x98))();
  pLVar18 = *(Logger **)(in_RSI + 0x48);
  uVar7 = Compaction::num_input_files((Compaction *)in_stack_fffffffffffffcd8,0);
  uVar8 = Compaction::level((Compaction *)in_stack_fffffffffffffcd8);
  uVar9 = Compaction::num_input_files((Compaction *)in_stack_fffffffffffffcd8,0);
  iVar10 = Compaction::level((Compaction *)in_stack_fffffffffffffcd8);
  Log(pLVar18,"Compacting %d@%d + %d@%d files",(ulong)uVar7,(ulong)uVar8,(ulong)uVar9,
      (ulong)(iVar10 + 1));
  Compaction::level((Compaction *)in_stack_fffffffffffffcd8);
  iVar10 = VersionSet::NumLevelFiles
                     ((VersionSet *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
  if (iVar10 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x381,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (*(long *)(in_RDX + 0x30) != 0) {
    __assert_fail("compact->builder == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x382,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (*(long *)(in_RDX + 0x28) != 0) {
    __assert_fail("compact->outfile == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,899,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  bVar1 = SnapshotList::empty((SnapshotList *)in_stack_fffffffffffffcd8);
  if (bVar1) {
    uVar14 = VersionSet::LastSequence((VersionSet *)in_stack_fffffffffffffcd8);
    *(uint64_t *)(in_RDX + 8) = uVar14;
  }
  else {
    SnapshotList::oldest((SnapshotList *)in_stack_fffffffffffffce8);
    SVar12 = SnapshotImpl::sequence_number((SnapshotImpl *)in_stack_fffffffffffffcd8);
    *(SequenceNumber *)(in_RDX + 8) = SVar12;
  }
  scratch = VersionSet::MakeInputIterator(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  port::Mutex::Unlock((Mutex *)in_stack_fffffffffffffcd8);
  (*scratch->_vptr_Iterator[3])();
  Status::Status((Status *)in_stack_fffffffffffffcd8);
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)in_stack_fffffffffffffcd8);
  std::__cxx11::string::string(in_stack_fffffffffffffcf0);
  bVar1 = false;
  local_1a0 = 0xffffffffffffff;
  while( true ) {
    uVar7 = (*scratch->_vptr_Iterator[2])();
    local_1fa = 0;
    if ((uVar7 & 1) != 0) {
      bVar2 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_fffffffffffffcf0,
                         (memory_order)((ulong)in_stack_fffffffffffffce8 >> 0x20));
      local_1fa = bVar2 ^ 0xff;
    }
    if ((local_1fa & 1) == 0) break;
    bVar2 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffffcf0,
                       (memory_order)((ulong)in_stack_fffffffffffffce8 >> 0x20));
    if (bVar2) {
      (**(code **)(**(long **)(in_RSI + 8) + 0x98))();
      port::Mutex::Lock((Mutex *)in_stack_fffffffffffffcd8);
      if (*(long *)(in_RSI + 0x138) != 0) {
        CompactMemTable((DBImpl *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        port::CondVar::SignalAll((CondVar *)in_stack_fffffffffffffcd8);
      }
      port::Mutex::Unlock((Mutex *)in_stack_fffffffffffffcd8);
      (**(code **)(**(long **)(in_RSI + 8) + 0x98))();
    }
    local_f8._56_4_ = (*scratch->_vptr_Iterator[8])();
    local_f8._60_4_ = extraout_var;
    bVar2 = Compaction::ShouldStopBefore
                      ((Compaction *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       in_stack_fffffffffffffd18);
    if ((bVar2) && (*(long *)(in_RDX + 0x30) != 0)) {
      FinishCompactionOutputFile
                (in_stack_fffffffffffffdb8,
                 (CompactionState *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffda8);
      Status::operator=((Status *)in_stack_fffffffffffffce8,
                        (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      Status::~Status((Status *)in_stack_fffffffffffffcd8);
      bVar2 = Status::ok((Status *)in_stack_fffffffffffffcd8);
      if (!bVar2) break;
    }
    bVar2 = false;
    bVar3 = ParseInternalKey((Slice *)in_stack_fffffffffffffcf0,
                             (ParsedInternalKey *)in_stack_fffffffffffffce8);
    if (bVar3) {
      bVar3 = true;
      if (bVar1) {
        pCVar13 = user_comparator(in_stack_fffffffffffffcd8);
        in_stack_fffffffffffffdb8 = (DBImpl *)(local_f8 + 0x48);
        Slice::Slice((Slice *)in_stack_fffffffffffffce8,
                     (string *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        in_stack_fffffffffffffdb4 =
             (*pCVar13->_vptr_Comparator[2])(pCVar13,in_stack_fffffffffffffdb8,local_f8 + 0x20);
        bVar3 = in_stack_fffffffffffffdb4 != 0;
      }
      if (bVar3) {
        in_stack_fffffffffffffda8 = (Iterator *)Slice::data((Slice *)in_stack_fffffffffffffcd8);
        Slice::size((Slice *)in_stack_fffffffffffffcd8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcff,
                            CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                   (char *)in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8);
        bVar1 = true;
        local_1a0 = 0xffffffffffffff;
      }
      if (*(ulong *)(in_RDX + 8) < local_1a0) {
        if (((local_98 == 0) && (local_a0 <= *(ulong *)(in_RDX + 8))) &&
           (bVar3 = Compaction::IsBaseLevelForKey
                              (in_stack_fffffffffffffd30,(Slice *)in_stack_fffffffffffffd28), bVar3)
           ) {
          bVar2 = true;
        }
      }
      else {
        bVar2 = true;
      }
      local_1a0 = local_a0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcd8);
      bVar1 = false;
      local_1a0 = 0xffffffffffffff;
    }
    if (!bVar2) {
      if (*(long *)(in_RDX + 0x30) == 0) {
        OpenCompactionOutputFile
                  (in_stack_fffffffffffffd28,
                   (CompactionState *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20))
        ;
        Status::operator=((Status *)in_stack_fffffffffffffce8,
                          (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        Status::~Status((Status *)in_stack_fffffffffffffcd8);
        bVar2 = Status::ok((Status *)in_stack_fffffffffffffcd8);
        if (!bVar2) break;
      }
      uVar14 = TableBuilder::NumEntries((TableBuilder *)in_stack_fffffffffffffcd8);
      if (uVar14 == 0) {
        CompactionState::current_output((CompactionState *)in_stack_fffffffffffffce8);
        InternalKey::DecodeFrom
                  ((InternalKey *)
                   CONCAT17(in_stack_fffffffffffffcff,
                            CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                   (Slice *)in_stack_fffffffffffffcf0);
      }
      CompactionState::current_output((CompactionState *)in_stack_fffffffffffffce8);
      InternalKey::DecodeFrom
                ((InternalKey *)
                 CONCAT17(in_stack_fffffffffffffcff,
                          CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                 (Slice *)in_stack_fffffffffffffcf0);
      iVar10 = (*scratch->_vptr_Iterator[9])();
      local_f8._8_8_ = CONCAT44(extraout_var_00,iVar10);
      TableBuilder::Add((TableBuilder *)
                        CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                        (Slice *)in_stack_fffffffffffffd40,
                        (Slice *)CONCAT17(in_stack_fffffffffffffd3f,
                                          CONCAT16(in_stack_fffffffffffffd3e,
                                                   CONCAT15(in_stack_fffffffffffffd3d,
                                                            in_stack_fffffffffffffd38))));
      uVar14 = TableBuilder::FileSize((TableBuilder *)in_stack_fffffffffffffcd8);
      uVar15 = Compaction::MaxOutputFileSize((Compaction *)in_stack_fffffffffffffcd8);
      if (uVar15 <= uVar14) {
        FinishCompactionOutputFile
                  (in_stack_fffffffffffffdb8,
                   (CompactionState *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffda8);
        in_stack_fffffffffffffd40 = (DBImpl *)local_f8;
        Status::operator=((Status *)in_stack_fffffffffffffce8,
                          (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        Status::~Status((Status *)in_stack_fffffffffffffcd8);
        in_stack_fffffffffffffd4f = Status::ok((Status *)in_stack_fffffffffffffcd8);
        if (!(bool)in_stack_fffffffffffffd4f) break;
      }
    }
    (*scratch->_vptr_Iterator[6])();
  }
  uVar4 = Status::ok((Status *)in_stack_fffffffffffffcd8);
  if (((bool)uVar4) &&
     (bVar1 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_fffffffffffffcf0,
                         (memory_order)((ulong)in_stack_fffffffffffffce8 >> 0x20)), bVar1)) {
    Slice::Slice((Slice *)in_stack_fffffffffffffce8,
                 (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Slice::Slice((Slice *)in_stack_fffffffffffffcd8);
    Status::IOError((Slice *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    (Slice *)in_stack_fffffffffffffcd8);
    Status::operator=((Status *)in_stack_fffffffffffffce8,
                      (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Status::~Status((Status *)in_stack_fffffffffffffcd8);
  }
  uVar5 = Status::ok((Status *)in_stack_fffffffffffffcd8);
  if (((bool)uVar5) && (*(long *)(in_RDX + 0x30) != 0)) {
    FinishCompactionOutputFile
              (in_stack_fffffffffffffdb8,
               (CompactionState *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffda8);
    Status::operator=((Status *)in_stack_fffffffffffffce8,
                      (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Status::~Status((Status *)in_stack_fffffffffffffcd8);
  }
  uVar6 = Status::ok((Status *)in_stack_fffffffffffffcd8);
  if ((bool)uVar6) {
    (*scratch->_vptr_Iterator[10])(local_130);
    Status::operator=((Status *)in_stack_fffffffffffffce8,
                      (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Status::~Status((Status *)in_stack_fffffffffffffcd8);
  }
  if (scratch != (Iterator *)0x0) {
    (*scratch->_vptr_Iterator[1])();
  }
  CompactionStats::CompactionStats((CompactionStats *)in_stack_fffffffffffffcd8);
  (**(code **)(**(long **)(in_RSI + 8) + 0x98))();
  for (local_1b0 = 0; local_1b0 < 2; local_1b0 = local_1b0 + 1) {
    local_1b4 = 0;
    while (iVar10 = local_1b4,
          iVar11 = Compaction::num_input_files((Compaction *)in_stack_fffffffffffffcd8,0),
          iVar10 < iVar11) {
      Compaction::input((Compaction *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                        in_stack_fffffffffffffce0);
      local_1b4 = local_1b4 + 1;
    }
  }
  for (local_1c0 = 0;
      sVar16 = std::
               vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
               ::size((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                       *)in_stack_fffffffffffffcd8), local_1c0 < sVar16; local_1c0 = local_1c0 + 1)
  {
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::operator[]((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                  *)in_stack_fffffffffffffce8,
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  }
  port::Mutex::Lock((Mutex *)in_stack_fffffffffffffcd8);
  Compaction::level((Compaction *)in_stack_fffffffffffffcd8);
  CompactionStats::Add((CompactionStats *)in_stack_fffffffffffffcd8,(CompactionStats *)0xd127dd);
  bVar1 = Status::ok((Status *)in_stack_fffffffffffffcd8);
  if (bVar1) {
    InstallCompactionResults
              (in_stack_fffffffffffffd40,
               (CompactionState *)
               CONCAT17(uVar4,CONCAT16(uVar5,CONCAT15(uVar6,in_stack_fffffffffffffd38))));
    Status::operator=((Status *)in_stack_fffffffffffffce8,
                      (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Status::~Status((Status *)in_stack_fffffffffffffcd8);
  }
  bVar1 = Status::ok((Status *)in_stack_fffffffffffffcd8);
  if (!bVar1) {
    RecordBackgroundError
              (in_stack_fffffffffffffce8,
               (Status *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  }
  pLVar18 = *(Logger **)(in_RSI + 0x48);
  pcVar17 = VersionSet::LevelSummary
                      ((VersionSet *)
                       CONCAT17(uVar4,CONCAT16(uVar5,CONCAT15(uVar6,in_stack_fffffffffffffd38))),
                       (LevelSummaryStorage *)scratch);
  Log(pLVar18,"compacted to: %s",pcVar17);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState* compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder == nullptr);
  assert(compact->outfile == nullptr);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->sequence_number();
  }

  Iterator* input = versions_->MakeInputIterator(compact->compaction);

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  while (input->Valid() && !shutting_down_.load(std::memory_order_acquire)) {
    // Prioritize immutable compaction work
    if (has_imm_.load(std::memory_order_relaxed)) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_ != nullptr) {
        CompactMemTable();
        // Wake up MakeRoomForWrite() if necessary.
        background_work_finished_signal_.SignalAll();
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder != nullptr) {
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key, Slice(current_user_key)) !=
              0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;  // (A)
      } else if (ikey.type == kTypeDeletion &&
                 ikey.sequence <= compact->smallest_snapshot &&
                 compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder == nullptr) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries() == 0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.load(std::memory_order_acquire)) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder != nullptr) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = nullptr;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log, "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}